

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O3

int Saig_ManDupCompare(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar3 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0x24);
  if (-1 < iVar3) {
    iVar4 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0x24);
    if (-1 < iVar4) {
      uVar1 = ((uint)*pp1 & 1) + iVar3 * 2;
      uVar2 = ((uint)*pp2 & 1) + iVar4 * 2;
      uVar5 = 0xffffffff;
      if (uVar2 <= uVar1) {
        uVar5 = (uint)(uVar1 != uVar2);
      }
      return uVar5;
    }
  }
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10b,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Saig_ManDupCompare( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjToLit(*pp1) - Aig_ObjToLit(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}